

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  ushort uVar1;
  int iVar2;
  u8 *__dest;
  void *pvVar3;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  char *in_RDI;
  CellInfo info;
  BtreePayload x2;
  UnpackedRecord r;
  uchar *newCell;
  uchar *oldCell;
  BtShared *pBt;
  Btree *p;
  MemPage *pPage;
  int idx;
  int szNew;
  int loc;
  int rc;
  BtCursor *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Pgno in_stack_ffffffffffffff44;
  BtShared *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  ushort in_stack_ffffffffffffff5c;
  short in_stack_ffffffffffffff5e;
  MemPage *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  u8 *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int *in_stack_ffffffffffffff90;
  i64 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  BtCursor *pCur_00;
  u8 *__src;
  int *in_stack_ffffffffffffffb0;
  BtShared *pX_00;
  Btree *pBtree;
  MemPage *pPage_00;
  int local_24;
  
  pBtree = *(Btree **)(in_RDI + 8);
  pX_00 = pBtree->pBt;
  pCur_00 = (BtCursor *)0x0;
  if (*in_RDI == '\x04') {
    return *(int *)(in_RDI + 4);
  }
  if (((in_RDI[1] & 0x20U) != 0) &&
     (iVar2 = saveAllCursors(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                             in_stack_ffffffffffffff38), iVar2 != 0)) {
    return iVar2;
  }
  if (*(long *)(in_RDI + 0x80) == 0) {
    invalidateIncrblobCursors(pBtree,*(Pgno *)(in_RDI + 0x50),in_RSI[1],0);
    if (((in_RDI[1] & 2U) == 0) || (in_RSI[1] != *(long *)(in_RDI + 0x30))) {
      if ((in_ECX == 0) &&
         (iVar2 = sqlite3BtreeMovetoUnpacked
                            (pCur_00,(UnpackedRecord *)
                                     CONCAT17(in_stack_ffffffffffffffa7,
                                              CONCAT16(in_stack_ffffffffffffffa6,
                                                       CONCAT15(in_stack_ffffffffffffffa5,
                                                                CONCAT14(in_stack_ffffffffffffffa4,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           in_stack_ffffffffffffffa0)))))),
                             in_stack_ffffffffffffff98,
                             (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                             (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
         iVar2 != 0)) {
        return iVar2;
      }
    }
    else if ((*(short *)(in_RDI + 0x46) != 0) &&
            (*(int *)(in_RDI + 0x40) == *(int *)((long)in_RSI + 0x24) + *(int *)(in_RSI + 5))) {
      iVar2 = btreeOverwriteCell((BtCursor *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 (BtreePayload *)in_stack_ffffffffffffff60);
      return iVar2;
    }
  }
  else {
    if ((in_ECX == 0) && ((in_EDX & 2) == 0)) {
      if (*(short *)(in_RSI + 4) == 0) {
        local_24 = btreeMoveto((BtCursor *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               in_stack_ffffffffffffff60,
                               CONCAT26(in_stack_ffffffffffffff5e,
                                        CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                )),in_stack_ffffffffffffff54,
                               (int *)in_stack_ffffffffffffff48);
      }
      else {
        in_stack_ffffffffffffff90 = *(int **)(in_RDI + 0x80);
        local_24 = sqlite3BtreeMovetoUnpacked
                             (pCur_00,(UnpackedRecord *)
                                      CONCAT17(in_stack_ffffffffffffffa7,
                                               (uint7)*(ushort *)(in_RSI + 4)),in_RSI[3],
                              (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                              (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((in_ECX == 0) && (getCellInfo((BtCursor *)0x169ba2), *(long *)(in_RDI + 0x30) == in_RSI[1]))
    {
      iVar2 = btreeOverwriteCell((BtCursor *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 (BtreePayload *)in_stack_ffffffffffffff60);
      return iVar2;
    }
  }
  pPage_00 = *(MemPage **)(in_RDI + 0x88);
  __src = pX_00->pTmpSpace;
  iVar2 = fillInCell(pPage_00,(uchar *)pBtree,(BtreePayload *)pX_00,in_stack_ffffffffffffffb0);
  if (iVar2 != 0) {
    return iVar2;
  }
  uVar1 = *(ushort *)(in_RDI + 0x56);
  if (in_ECX == 0) {
    iVar2 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff38);
    if (iVar2 != 0) {
      return iVar2;
    }
    __dest = pPage_00->aData +
             (int)(uint)(pPage_00->maskPage &
                        CONCAT11(pPage_00->aCellIdx[(int)((uint)uVar1 << 1)],
                                 pPage_00->aCellIdx[(long)(int)((uint)uVar1 << 1) + 1]));
    if (pPage_00->leaf == '\0') {
      *(undefined4 *)__src = *(undefined4 *)__dest;
    }
    local_24 = clearCell((MemPage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70,
                         (CellInfo *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (((in_stack_ffffffffffffff5e == 0) &&
        (in_stack_ffffffffffffff5c == in_stack_ffffffffffffff58)) &&
       ((pX_00->autoVacuum == '\0' || (pPage_00->minLocal != 0)))) {
      if (__dest <= pPage_00->aDataEnd) {
        memcpy(__dest,__src,0);
        return 0;
      }
      iVar2 = sqlite3CorruptError(0);
      return iVar2;
    }
    dropCell(in_stack_ffffffffffffff60,CONCAT22(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c)
             ,in_stack_ffffffffffffff58,
             (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (local_24 != 0) {
      return local_24;
    }
  }
  else {
    local_24 = 0;
    if ((in_ECX < 0) && (pPage_00->nCell != 0)) {
      *(short *)(in_RDI + 0x56) = *(short *)(in_RDI + 0x56) + 1;
      in_RDI[1] = in_RDI[1] & 0xfd;
    }
  }
  insertCell((MemPage *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             &in_stack_ffffffffffffff60->isInit,
             CONCAT22(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c),in_stack_ffffffffffffff90
            );
  in_RDI[0x46] = '\0';
  in_RDI[0x47] = '\0';
  if (pPage_00->nOverflow != '\0') {
    in_RDI[1] = in_RDI[1] & 0xfd;
    local_24 = balance((BtCursor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    *(undefined1 *)(*(long *)(in_RDI + 0x88) + 0xc) = 0;
    *in_RDI = '\x01';
    if (((in_EDX & 2) != 0) && (local_24 == 0)) {
      btreeReleaseAllCursorPages
                ((BtCursor *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if (*(long *)(in_RDI + 0x80) != 0) {
        pvVar3 = sqlite3Malloc(CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        *(void **)(in_RDI + 0x18) = pvVar3;
        if (*(long *)(in_RDI + 0x18) == 0) {
          local_24 = 7;
        }
        else {
          memcpy(*(void **)(in_RDI + 0x18),(void *)*in_RSI,in_RSI[1]);
        }
      }
      *in_RDI = '\x03';
      *(undefined8 *)(in_RDI + 0x48) = in_RSI[1];
    }
  }
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( pCur->info.nSize!=0 );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.errCode = 0;
        r.r1 = 0;
        r.r2 = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }

  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}